

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_consume.cc
# Opt level: O0

void __thiscall
absl::lts_20250127::cord_internal::Consume
          (cord_internal *this,CordRep *rep,
          FunctionRef<void_(absl::lts_20250127::cord_internal::CordRep_*,_unsigned_long,_unsigned_long)>
          consume_fn)

{
  unsigned_long args_2;
  CordRepSubstring *pCVar1;
  size_t length;
  size_t offset;
  CordRep *rep_local;
  FunctionRef<void_(absl::lts_20250127::cord_internal::CordRep_*,_unsigned_long,_unsigned_long)>
  consume_fn_local;
  
  consume_fn_local.ptr_ = consume_fn.ptr_;
  length = 0;
  args_2 = *(unsigned_long *)this;
  offset = (size_t)this;
  rep_local = rep;
  if (this[0xc] == (cord_internal)0x1) {
    pCVar1 = CordRep::substring((CordRep *)this);
    length = pCVar1->start;
    pCVar1 = CordRep::substring((CordRep *)this);
    offset = (size_t)anon_unknown_10::ClipSubstring(pCVar1);
  }
  FunctionRef<void_(absl::lts_20250127::cord_internal::CordRep_*,_unsigned_long,_unsigned_long)>::
  operator()((FunctionRef<void_(absl::lts_20250127::cord_internal::CordRep_*,_unsigned_long,_unsigned_long)>
              *)&rep_local,(CordRep *)offset,length,args_2);
  return;
}

Assistant:

void Consume(CordRep* rep,
             FunctionRef<void(CordRep*, size_t, size_t)> consume_fn) {
  size_t offset = 0;
  size_t length = rep->length;

  if (rep->tag == SUBSTRING) {
    offset += rep->substring()->start;
    rep = ClipSubstring(rep->substring());
  }
  consume_fn(rep, offset, length);
}